

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testDynamicLoader.cxx
# Opt level: O1

int TestDynamicLoader(char *libname,char *symbol,int r1,int r2,int r3)

{
  int iVar1;
  size_t sVar2;
  LibraryHandle lib;
  SymbolPointer p_Var3;
  char *__s;
  allocator local_55;
  int local_54;
  string local_50;
  
  local_54 = r3;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Testing: ",9);
  if (libname == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x14a6e8);
  }
  else {
    sVar2 = strlen(libname);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,libname,sVar2);
  }
  std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x18);
  std::ostream::put(-0x18);
  std::ostream::flush();
  std::__cxx11::string::string((string *)&local_50,libname,&local_55);
  lib = cmsys::DynamicLoader::OpenLibrary(&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((r1 == 0) == (lib == (LibraryHandle)0x0)) {
    std::__cxx11::string::string((string *)&local_50,symbol,&local_55);
    p_Var3 = cmsys::DynamicLoader::GetSymbolAddress(lib,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    if (((r2 == 0) == (p_Var3 == (SymbolPointer)0x0)) &&
       (iVar1 = cmsys::DynamicLoader::CloseLibrary(lib), (local_54 == 0) == (iVar1 == 0))) {
      return 0;
    }
  }
  __s = cmsys::DynamicLoader::LastError();
  if (__s == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x14a6e8);
  }
  else {
    sVar2 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,__s,sVar2);
  }
  std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x18);
  std::ostream::put(-0x18);
  std::ostream::flush();
  return 1;
}

Assistant:

int TestDynamicLoader(const char* libname, const char* symbol, int r1, int r2, int r3)
{
  std::cerr << "Testing: " << libname << std::endl;
  kwsys::DynamicLoader::LibraryHandle l
    = kwsys::DynamicLoader::OpenLibrary(libname);
  // If result is incompatible with expectation just fails (xor):
  if( (r1 && !l) || (!r1 && l) )
    {
    std::cerr
      << kwsys::DynamicLoader::LastError() << std::endl;
    return 1;
    }
  kwsys::DynamicLoader::SymbolPointer f
    = kwsys::DynamicLoader::GetSymbolAddress(l, symbol);
  if( (r2 && !f) || (!r2 && f) )
    {
    std::cerr
      << kwsys::DynamicLoader::LastError() << std::endl;
    return 1;
    }
#ifndef __APPLE__
  int s = kwsys::DynamicLoader::CloseLibrary(l);
  if( (r3 && !s) || (!r3 && s) )
    {
    std::cerr
      << kwsys::DynamicLoader::LastError() << std::endl;
    return 1;
    }
#else
  (void)r3;
#endif
  return 0;
}